

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address_source.cpp
# Opt level: O0

string * __thiscall
address_source::address_abi_cxx11_(string *__return_storage_ptr__,address_source *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  address_source *local_18;
  address_source *this_local;
  
  local_18 = this;
  this_local = (address_source *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,this->cur_[0]);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->cur_[1]);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->cur_[2]);
  poVar1 = std::operator<<(poVar1,'.');
  std::ostream::operator<<(poVar1,this->cur_[3]);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string
address_source::address() const
{
    std::stringstream ss{};
    ss << cur_[0] << '.' << cur_[1] << '.' << cur_[2] << '.' << cur_[3];
    return ss.str();
}